

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O3

void __thiscall psy::C::MemoryPool::~MemoryPool(MemoryPool *this)

{
  int iVar1;
  char **__ptr;
  long lVar2;
  
  __ptr = this->blocks_;
  if (__ptr != (char **)0x0) {
    iVar1 = this->allocatedBlocks_;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (this->blocks_[lVar2] != (char *)0x0) {
          free(this->blocks_[lVar2]);
          iVar1 = this->allocatedBlocks_;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = this->blocks_;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

MemoryPool::~MemoryPool()
{
    if (blocks_) {
        for (int i = 0; i < allocatedBlocks_; ++i) {
            if (char* b = blocks_[i])
                std::free(b);
        }
        std::free(blocks_);
    }
}